

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall
SquareRootUnscentedKalmanFilter_init_Test::TestBody(SquareRootUnscentedKalmanFilter_init_Test *this)

{
  AssertionResult *this_00;
  AssertHelper *this_01;
  char *in_R9;
  undefined1 local_214 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ukfMatrix;
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  AssertionResult gtest_ar__1;
  AssertHelper local_20;
  
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_214,1.0,2.0,1.0);
  ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info._0_1_ =
       Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                 ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                  &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
  this_00 = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if ((bool)(undefined1)
            ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
            super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
            super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    Kalman::SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::
    SquareRootUnscentedKalmanFilter
              ((SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,1.0,2.0,1.0);
    local_38.data_._0_1_ =
         (internal)
         Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                   ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                    &ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                     .gamma);
    this_00 = &gtest_ar__1;
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if ((bool)local_38.data_._0_1_) goto LAB_0018eb5e;
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,(internal *)&local_38,
               (AssertionResult *)"ukfMatrix.S.isIdentity()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0x12,(char *)CONCAT71(stack0xffffffffffffffa9,
                                      (undefined1)
                                      ukfMatrix.
                                      super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                      .super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                                      super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    std::__cxx11::string::~string
              ((string *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info);
    this_01 = &local_20;
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,
               (internal *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,
               (AssertionResult *)"ukf.S.isIdentity()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xe,(char *)ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                            super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                            super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string
              ((string *)
               &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized);
    this_01 = &local_38;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
LAB_0018eb5e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, init) {
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(1,2,1);
    ASSERT_TRUE(ukf.S.isIdentity()); // S should be identity

    // Same as above, but with general matrix type instead of vector
    auto ukfMatrix = SquareRootUnscentedKalmanFilter<Matrix<T, 3, 1>>(1,2,1);
    ASSERT_TRUE(ukfMatrix.S.isIdentity()); // S should be identity
}